

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall NbhReadWriter::scanfile(NbhReadWriter *this)

{
  element_type *peVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  uint32_t uVar8;
  uint64_t logicalpos;
  i32map_t ss_stats;
  i32map_t ds_stats;
  key_type_conflict local_c0;
  uint32_t local_b8;
  undefined4 uStack_b4;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  uVar8 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0 = 0;
  lVar7 = 0x17;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    peVar1 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_ReadWriter[4])(peVar1,lVar7);
    local_98 = 0;
    uStack_a0 = 0;
    local_a8 = local_c0;
    local_b8 = uVar8;
    uStack_b0 = lVar7;
    uVar3 = ReadWriter::read32le
                      ((this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    uStack_a0 = CONCAT44(uStack_a0._4_4_,uVar3);
    uVar3 = ReadWriter::read32le
                      ((this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    uStack_a0 = CONCAT44(uVar3,(key_type)uStack_a0);
    uVar2 = ReadWriter::read8((this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
    local_98 = CONCAT11(local_98._1_1_,uVar2);
    if (g_verbose != 0) {
      pmVar4 = std::
               map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                             *)&local_60,(key_type *)&uStack_a0);
      *pmVar4 = *pmVar4 + 1;
      pmVar4 = std::
               map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                             *)&local_90,(key_type *)((long)&uStack_a0 + 4));
      *pmVar4 = *pmVar4 + 1;
    }
    pmVar5 = std::
             map<unsigned_long,_NbhReadWriter::blockinfo,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_NbhReadWriter::blockinfo>_>_>
             ::operator[](&this->_blocks,&local_c0);
    pmVar5->flag = (char)local_98;
    pmVar5->modified = (bool)local_98._1_1_;
    *(undefined4 *)&pmVar5->logicaloffset = (undefined4)local_a8;
    *(undefined4 *)((long)&pmVar5->logicaloffset + 4) = local_a8._4_4_;
    pmVar5->datasize = (key_type)uStack_a0;
    pmVar5->sigsize = uStack_a0._4_4_;
    pmVar5->ix = local_b8;
    *(undefined4 *)&pmVar5->field_0x4 = uStack_b4;
    *(undefined4 *)&pmVar5->fileoffset = (undefined4)uStack_b0;
    *(undefined4 *)((long)&pmVar5->fileoffset + 4) = uStack_b0._4_4_;
    local_c0 = local_c0 + (uStack_a0 & 0xffffffff);
    lVar7 = lVar7 + (uStack_a0 & 0xffffffff) + (ulong)uStack_a0._4_4_ + 9;
    uVar8 = uVar8 + 1;
  } while ((char)local_98 != '\x02');
  if (g_verbose != 0) {
    printf("ds: ");
    for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      printf(" %08x:%d",(ulong)p_Var6[1]._M_color,(ulong)*(uint *)&p_Var6[1].field_0x4);
    }
    putchar(10);
    printf("ss: ");
    for (p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_90._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      printf(" %08x:%d",(ulong)p_Var6[1]._M_color,(ulong)*(uint *)&p_Var6[1].field_0x4);
    }
    putchar(10);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void scanfile()
    {
        typedef std::map<uint32_t,int> i32map_t;
        i32map_t ds_stats;
        i32map_t ss_stats;
        uint64_t filepos= 0x17;
        uint64_t logicalpos= 0;
        uint32_t ix= 0;
        while (true)
        {
            _r->setpos(filepos);

            blockinfo blk;
            blk.ix= ix;
            blk.fileoffset= filepos;
            blk.logicaloffset= logicalpos;
            blk.datasize= _r->read32le();
            blk.sigsize= _r->read32le();
            blk.flag= _r->read8();

            if (g_verbose) {
                ds_stats[blk.datasize]++;
                ss_stats[blk.sigsize]++;
            }

            _blocks[logicalpos]= blk;

            filepos+= blk.physicalsize();
            logicalpos+= blk.datasize;
            ix++;

            if (blk.flag==2)
                break;
        }
        if (g_verbose) {
            printf("ds: ");
            for (auto i= ds_stats.begin() ; i!=ds_stats.end() ; ++i)
                printf(" %08x:%d", i->first, i->second);
            printf("\n");
            printf("ss: ");
            for (auto i= ss_stats.begin() ; i!=ss_stats.end() ; ++i)
                printf(" %08x:%d", i->first, i->second);
            printf("\n");
        }
    }